

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::EmbeddingNDLayerParams::MergePartialFromCodedStream
          (EmbeddingNDLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  int iVar5;
  uint uVar6;
  uint32 uVar7;
  WeightParams *pWVar8;
  ulong extraout_RAX;
  uint8 *puVar9;
  ulong extraout_RAX_00;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  int local_48;
  int local_44;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar7 = (uint)bVar2, (~(uint)*pbVar1 & uVar11) < 0x80)) goto LAB_00216710;
        uVar11 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = (ulong)uVar11 | 0x100000000;
    }
    else {
LAB_00216710:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_00216554;
    uVar6 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    if (uVar6 < 3) {
      if (uVar6 == 1) {
        if (cVar10 != '\b') goto LAB_00216554;
        puVar9 = input->buffer_;
        if ((input->buffer_end_ <= puVar9) || ((long)(char)*puVar9 < 0)) {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->vocabsize_ = pVar13.first;
          goto LAB_002166fd;
        }
        this->vocabsize_ = (long)(char)*puVar9;
LAB_0021664f:
        input->buffer_ = puVar9 + 1;
LAB_0021657f:
        iVar5 = 0;
      }
      else {
        if ((uVar6 != 2) || (cVar10 != '\x10')) goto LAB_00216554;
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (-1 < (long)(char)*puVar9)) {
          this->embeddingsize_ = (long)(char)*puVar9;
          goto LAB_0021664f;
        }
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->embeddingsize_ = pVar13.first;
LAB_002166fd:
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_0021657f;
LAB_00216706:
        iVar5 = 6;
      }
    }
    else if (uVar6 == 0x14) {
      if (cVar10 != -0x5e) goto LAB_00216554;
      if (this->weights_ == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar8);
        this->weights_ = pWVar8;
      }
      MergePartialFromCodedStream();
      iVar5 = local_44;
      if ((extraout_RAX_00 & 1) == 0) goto LAB_0021657f;
    }
    else {
      if (uVar6 == 0x15) {
        if (cVar10 == -0x56) {
          if (this->bias_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->bias_ = pWVar8;
          }
          MergePartialFromCodedStream();
          iVar5 = local_48;
          if ((extraout_RAX & 1) != 0) goto LAB_00216581;
          goto LAB_0021657f;
        }
      }
      else if ((uVar6 == 3) && (MergePartialFromCodedStream(), extraout_AX != 0)) {
        iVar5 = 6;
        if (extraout_AX != 1) goto LAB_0021657f;
        goto LAB_00216581;
      }
LAB_00216554:
      iVar5 = 7;
      if ((uVar11 & 7) != 4 && uVar11 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar11);
        if (!bVar4) goto LAB_00216706;
        goto LAB_0021657f;
      }
    }
LAB_00216581:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool EmbeddingNDLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.EmbeddingNDLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 vocabSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &vocabsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 embeddingSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &embeddingsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.EmbeddingNDLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.EmbeddingNDLayerParams)
  return false;
#undef DO_
}